

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O0

void __thiscall de::anon_unknown_0::TestThread::run(TestThread *this)

{
  SpinBarrier *pSVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deBool dVar4;
  bool bVar5;
  int local_28;
  undefined1 local_24 [4];
  int iterNdx;
  Random rnd;
  int numIters;
  TestThread *this_local;
  
  rnd.m_rnd.z = 10000;
  unique0x1000024b = this;
  dVar2 = deInt32Hash(this->m_numThreads);
  dVar3 = deInt32Hash(this->m_threadNdx);
  Random::Random((Random *)local_24,dVar2 ^ dVar3);
  for (local_28 = 0; local_28 < 10000; local_28 = local_28 + 1) {
    ::deAtomicIncrementInt32(this->m_sharedVar);
    pSVar1 = this->m_barrier;
    getWaitMode(this,(Random *)local_24);
    SpinBarrier::sync(pSVar1);
    do {
      dVar4 = ::deGetFalse();
      bVar5 = false;
      if (dVar4 == 0) {
        bVar5 = *this->m_sharedVar == this->m_numThreads;
      }
      if (!bVar5) {
        deAssertFail("*m_sharedVar == m_numThreads",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deSpinBarrier.cpp"
                     ,0xc5);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    pSVar1 = this->m_barrier;
    getWaitMode(this,(Random *)local_24);
    SpinBarrier::sync(pSVar1);
    ::deAtomicDecrementInt32(this->m_sharedVar);
    pSVar1 = this->m_barrier;
    getWaitMode(this,(Random *)local_24);
    SpinBarrier::sync(pSVar1);
    do {
      dVar4 = ::deGetFalse();
      bVar5 = false;
      if (dVar4 == 0) {
        bVar5 = *this->m_sharedVar == 0;
      }
      if (!bVar5) {
        deAssertFail("*m_sharedVar == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deSpinBarrier.cpp"
                     ,0xcf);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    pSVar1 = this->m_barrier;
    getWaitMode(this,(Random *)local_24);
    SpinBarrier::sync(pSVar1);
  }
  Random::~Random((Random *)local_24);
  return;
}

Assistant:

void run (void)
	{
		const int	numIters	= 10000;
		de::Random	rnd			(deInt32Hash(m_numThreads) ^ deInt32Hash(m_threadNdx));

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Phase 1: count up
			deAtomicIncrement32(m_sharedVar);

			// Verify
			m_barrier.sync(getWaitMode(rnd));

			DE_TEST_ASSERT(*m_sharedVar == m_numThreads);

			m_barrier.sync(getWaitMode(rnd));

			// Phase 2: count down
			deAtomicDecrement32(m_sharedVar);

			// Verify
			m_barrier.sync(getWaitMode(rnd));

			DE_TEST_ASSERT(*m_sharedVar == 0);

			m_barrier.sync(getWaitMode(rnd));
		}
	}